

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

string * __thiscall
duckdb::LogicalType::GetAlias_abi_cxx11_(string *__return_storage_ptr__,LogicalType *this)

{
  element_type *in_RAX;
  ExtraTypeInfo *pEVar1;
  pointer pcVar2;
  pointer pcVar3;
  optional_ptr<duckdb::ExtraTypeInfo,_true> info;
  optional_ptr<duckdb::ExtraTypeInfo,_true> local_18;
  
  if (this->id_ == USER) {
    local_18.ptr = (this->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    optional_ptr<duckdb::ExtraTypeInfo,_true>::CheckValid(&local_18);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = *(pointer *)&local_18.ptr[2].type;
    pcVar2 = local_18.ptr[2].alias._M_dataplus._M_p;
  }
  else {
    if ((this->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    local_18.ptr = in_RAX;
    pEVar1 = shared_ptr<duckdb::ExtraTypeInfo,_true>::operator->(&this->type_info_);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (pEVar1->alias)._M_dataplus._M_p;
    pcVar2 = (pointer)(pEVar1->alias)._M_string_length;
  }
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar3,pcVar2 + (long)pcVar3);
  return __return_storage_ptr__;
}

Assistant:

string LogicalType::GetAlias() const {
	if (id() == LogicalTypeId::USER) {
		return UserType::GetTypeName(*this);
	}
	if (type_info_) {
		return type_info_->alias;
	}
	return string();
}